

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  int iVar2;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,argv,
             argv + argc,(allocator_type *)local_108);
  if ((ulong)((long)local_e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    printUsage();
    goto LAB_0011cb3e;
  }
  pcVar1 = local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar1,
             pcVar1 + local_e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_108);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)local_108);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)local_108);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)local_108);
        if (iVar2 == 0) {
LAB_0011cb48:
          test(&local_e8);
LAB_0011cb52:
          predict(&local_e8);
LAB_0011cb5c:
          quantize(&local_e8);
LAB_0011cb66:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_28,&local_e8);
          printWordVectors(&local_28);
LAB_0011cb85:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_40,&local_e8);
          printSentenceVectors(&local_40);
LAB_0011cba4:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_58,&local_e8);
          printNgrams(&local_58);
LAB_0011cbc3:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_70,&local_e8);
          printNgramsEx(&local_70);
LAB_0011cbe2:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_88,&local_e8);
          nn(&local_88);
LAB_0011cc01:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a0,&local_e8);
          nnComp(&local_a0);
LAB_0011cc1a:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_b8,&local_e8);
          analogies(&local_b8);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb48;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb5c;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb66;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb85;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cba4;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cbc3;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cbe2;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cc01;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cc1a;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb52;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) goto LAB_0011cb52;
          iVar2 = std::__cxx11::string::compare((char *)local_108);
          if (iVar2 == 0) {
            dump(&local_e8);
            goto LAB_0011cb14;
          }
        }
        printUsage();
LAB_0011cb3e:
        exit(1);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,&local_e8);
  train(&local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
LAB_0011cb14:
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::vector<std::string> args(argv, argv + argc);
  if (args.size() < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(args[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(args);
  } else if (command == "test" || command == "test-label") {
    test(args);
  } else if (command == "quantize") {
    quantize(args);
  } else if (command == "print-word-vectors") {
    printWordVectors(args);
  } else if (command == "print-sentence-vectors") {
    printSentenceVectors(args);
  } else if (command == "print-ngrams") {
    printNgrams(args);
  } else if (command == "print-ngramsex") {
      printNgramsEx(args);
  } else if (command == "nn") {
    nn(args);
  } else if (command == "nncomp") {
    nnComp(args);
  } else if (command == "analogies") {
    analogies(args);
  } else if (command == "predict" || command == "predict-prob") {
    predict(args);
  } else if (command == "dump") {
    dump(args);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  return 0;
}